

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

IFStmt * new_if_stmt(void *expr,void *block,void *els)

{
  Token *pTVar1;
  void *any;
  IFStmt *pIVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x28);
  pIVar2 = (IFStmt *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,if_eval);
  pTVar1 = pTVar3->token;
  (pIVar2->node).eval = pTVar3->eval;
  (pIVar2->node).token = pTVar1;
  pIVar2->expr = expr;
  pIVar2->block = block;
  pIVar2->els = els;
  return pIVar2;
}

Assistant:

IFStmt* new_if_stmt(void* expr, void* block, void* els){
    IFStmt* stmt = new(IFStmt);
    stmt->node = tree_node_(NULL, eval_handler(if_eval));
    stmt->expr = expr;
    stmt->block = block;
    stmt->els = els;
    return stmt;
}